

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnMemory(SharedValidator *this,Location *loc,Limits *limits)

{
  pointer *ppMVar1;
  iterator __position;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined6 uVar4;
  Result RVar5;
  char *format;
  byte bVar6;
  bool bVar7;
  MemoryType local_48;
  
  if ((this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar7 = false;
  }
  else {
    RVar5 = PrintError(this,loc,"only one memory block allowed");
    bVar7 = RVar5.enum_ == Error;
  }
  RVar5 = CheckLimits(this,loc,limits,0x10000,"pages");
  bVar6 = RVar5.enum_ == Error | bVar7;
  if (limits->is_shared == true) {
    if ((this->options_).features.threads_enabled_ == true) {
      if (limits->has_max != false) goto LAB_0017136d;
      format = "shared memories must have max sizes";
    }
    else {
      format = "memories may not be shared";
    }
    RVar5 = PrintError(this,loc,format);
    bVar6 = bVar6 | RVar5.enum_ == Error;
  }
LAB_0017136d:
  local_48.limits.has_max = limits->has_max;
  local_48.limits.is_shared = limits->is_shared;
  local_48.limits._18_6_ = *(undefined6 *)&limits->field_0x12;
  local_48.limits.initial = limits->initial;
  local_48.limits.max = limits->max;
  __position._M_current =
       (this->memories_).
       super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->memories_).
      super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>::
    _M_realloc_insert<wabt::SharedValidator::MemoryType>(&this->memories_,__position,&local_48);
  }
  else {
    uVar2 = limits->initial;
    uVar3 = limits->max;
    bVar7 = limits->is_shared;
    uVar4 = *(undefined6 *)&limits->field_0x12;
    ((__position._M_current)->limits).has_max = limits->has_max;
    ((__position._M_current)->limits).is_shared = bVar7;
    *(undefined6 *)&((__position._M_current)->limits).field_0x12 = uVar4;
    ((__position._M_current)->limits).initial = uVar2;
    ((__position._M_current)->limits).max = uVar3;
    ppMVar1 = &(this->memories_).
               super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  RVar5.enum_._1_3_ = 0;
  RVar5.enum_._0_1_ = bVar6;
  return (Result)RVar5.enum_;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc, const Limits& limits) {
  Result result = Result::Ok;
  if (memories_.size() > 0) {
    result |= PrintError(loc, "only one memory block allowed");
  }
  result |= CheckLimits(loc, limits, WABT_MAX_PAGES, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}